

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O1

void __thiscall ViewTest::transposeTest<true>(ViewTest *this)

{
  int iVar1;
  undefined8 uVar2;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var3;
  reference piVar4;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var5;
  size_t sVar6;
  size_t sVar7;
  logic_error *plVar8;
  code *pcVar9;
  unsigned_long uVar10;
  unsigned_long uVar11;
  value_type *__val_2;
  undefined *puVar12;
  value_type *__val_1;
  int *piVar13;
  size_t sVar14;
  long lVar15;
  value_type *__val;
  size_t sVar16;
  View<int,_true,_std::allocator<unsigned_long>_> w1;
  View<int,_true,_std::allocator<unsigned_long>_> v;
  View<int,_true,_std::allocator<unsigned_long>_> w2;
  View<int,_true,_std::allocator<unsigned_long>_> w3;
  undefined1 local_138 [16];
  size_t *local_128;
  size_t local_110;
  undefined1 local_f8 [16];
  size_t *local_e8;
  size_t local_d0;
  allocator_type local_b5;
  CoordinateOrder local_b4;
  undefined1 local_b0 [16];
  size_t *local_a0;
  size_t local_88;
  undefined1 local_70 [16];
  size_t *local_60;
  size_t local_48;
  
  _Var3._M_current = (unsigned_long *)operator_new(0x10);
  _Var5._M_current = _Var3._M_current + 2;
  *_Var3._M_current = 0;
  _Var3._M_current[1] = 0;
  *_Var3._M_current = 6;
  _Var3._M_current[1] = 4;
  piVar13 = this->data_;
  local_f8._0_8_ = piVar13;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_f8 + 8),_Var3,_Var5,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)local_138);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_f8);
  local_138._0_8_ = piVar13;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_138 + 8),_Var3,_Var5,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)local_b0);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138);
  local_b0._0_8_ = piVar13;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_b0 + 8),_Var3,_Var5,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)local_70);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_b0);
  local_70._0_8_ = piVar13;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_70 + 8),_Var3,_Var5,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)&local_b4);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_70);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::transpose
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138,0,1);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::transpose
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_b0,0,0);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::transpose
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_70,1,1);
  sVar16 = 0;
  do {
    sVar14 = 0;
    do {
      piVar4 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_f8,sVar16,sVar14);
      iVar1 = *piVar4;
      piVar4 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_138,sVar14,sVar16);
      if (iVar1 != *piVar4) {
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar8,"test failed.");
        __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      piVar4 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_f8,sVar16,sVar14);
      iVar1 = *piVar4;
      piVar4 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_b0,sVar16,sVar14);
      if (iVar1 != *piVar4) {
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar8,"test failed.");
        __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      piVar4 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_f8,sVar16,sVar14);
      iVar1 = *piVar4;
      piVar4 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_70,sVar16,sVar14);
      if (iVar1 != *piVar4) {
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar8,"test failed.");
        __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      sVar14 = sVar14 + 1;
    } while (sVar14 != 4);
    sVar16 = sVar16 + 1;
  } while (sVar16 != 6);
  operator_delete(local_60,local_48 * 0x18);
  operator_delete(local_a0,local_88 * 0x18);
  operator_delete(local_128,local_110 * 0x18);
  operator_delete(local_e8,local_d0 * 0x18);
  operator_delete(_Var3._M_current,0x10);
  _Var3._M_current = (unsigned_long *)operator_new(0x10);
  _Var5._M_current = _Var3._M_current + 2;
  *_Var3._M_current = 0;
  _Var3._M_current[1] = 0;
  *_Var3._M_current = 6;
  _Var3._M_current[1] = 4;
  local_138._0_8_ = local_138._0_8_ & 0xffffffff00000000;
  local_f8._0_8_ = piVar13;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_f8 + 8),_Var3,_Var5,
             (CoordinateOrder *)local_138,&andres::defaultOrder,(allocator_type *)local_b0);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_f8);
  local_b0._0_8_ = local_b0._0_8_ & 0xffffffff00000000;
  local_138._0_8_ = piVar13;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_138 + 8),_Var3,_Var5,
             (CoordinateOrder *)local_b0,&andres::defaultOrder,(allocator_type *)local_70);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138);
  local_70._0_8_ = local_70._0_8_ & 0xffffffff00000000;
  local_b0._0_8_ = piVar13;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_b0 + 8),_Var3,_Var5,
             (CoordinateOrder *)local_70,&andres::defaultOrder,(allocator_type *)&local_b4);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_b0);
  local_b4 = FirstMajorOrder;
  local_70._0_8_ = piVar13;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_70 + 8),_Var3,_Var5,&local_b4,
             &andres::defaultOrder,&local_b5);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_70);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::transpose
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138,0,1);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::transpose
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_b0,0,0);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::transpose
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_70,1,1);
  sVar16 = 0;
  do {
    sVar14 = 0;
    do {
      piVar4 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_f8,sVar16,sVar14);
      iVar1 = *piVar4;
      piVar4 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_138,sVar14,sVar16);
      if (iVar1 != *piVar4) {
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar8,"test failed.");
        __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      piVar4 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_f8,sVar16,sVar14);
      iVar1 = *piVar4;
      piVar4 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_b0,sVar16,sVar14);
      if (iVar1 != *piVar4) {
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar8,"test failed.");
        __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      piVar4 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_f8,sVar16,sVar14);
      iVar1 = *piVar4;
      piVar4 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_70,sVar16,sVar14);
      if (iVar1 != *piVar4) {
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar8,"test failed.");
        __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      sVar14 = sVar14 + 1;
    } while (sVar14 != 4);
    sVar16 = sVar16 + 1;
  } while (sVar16 != 6);
  operator_delete(local_60,local_48 * 0x18);
  operator_delete(local_a0,local_88 * 0x18);
  operator_delete(local_128,local_110 * 0x18);
  operator_delete(local_e8,local_d0 * 0x18);
  operator_delete(_Var3._M_current,0x10);
  _Var5._M_current = (unsigned_long *)operator_new(0x18);
  *_Var5._M_current = 0;
  _Var5._M_current[1] = 0;
  *_Var5._M_current = 3;
  _Var5._M_current[1] = 4;
  _Var5._M_current[2] = 2;
  local_f8._0_8_ = piVar13;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_f8 + 8),_Var5,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var5._M_current + 3),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)local_138);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_f8);
  local_138._0_8_ = piVar13;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_138 + 8),_Var5,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var5._M_current + 3),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)local_b0);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::transpose
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138,0,1);
  sVar16 = 0;
  do {
    sVar14 = 0;
    do {
      uVar10 = 0;
      do {
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_f8);
        uVar2 = local_f8._0_8_;
        if (((int *)local_f8._0_8_ == (int *)0x0) || (local_d0 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
LAB_001aa168:
          pcVar9 = std::runtime_error::~runtime_error;
          puVar12 = &std::runtime_error::typeinfo;
LAB_001aa176:
          __cxa_throw(plVar8,puVar12,pcVar9);
        }
        sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_f8,0);
        sVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_f8,3,sVar14,
                           uVar10);
        iVar1 = *(int *)(uVar2 + (sVar6 * sVar16 + sVar7) * 4);
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138);
        uVar2 = local_138._0_8_;
        if (((int *)local_138._0_8_ == (int *)0x0) || (local_110 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
          goto LAB_001aa168;
        }
        sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138,0);
        sVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138,3,sVar16,
                           uVar10);
        if (iVar1 != *(int *)(uVar2 + (sVar6 * sVar14 + sVar7) * 4)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar8,"test failed.");
          pcVar9 = std::logic_error::~logic_error;
          puVar12 = &std::logic_error::typeinfo;
          goto LAB_001aa176;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 == 1);
      sVar14 = sVar14 + 1;
    } while (sVar14 != 4);
    sVar16 = sVar16 + 1;
  } while (sVar16 != 3);
  operator_delete(local_128,local_110 * 0x18);
  operator_delete(local_e8,local_d0 * 0x18);
  operator_delete(_Var5._M_current,0x18);
  _Var5._M_current = (unsigned_long *)operator_new(0x18);
  *_Var5._M_current = 0;
  _Var5._M_current[1] = 0;
  *_Var5._M_current = 3;
  _Var5._M_current[1] = 4;
  _Var5._M_current[2] = 2;
  local_138._0_8_ = local_138._0_8_ & 0xffffffff00000000;
  local_f8._0_8_ = piVar13;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_f8 + 8),_Var5,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var5._M_current + 3),(CoordinateOrder *)local_138,&andres::defaultOrder,
             (allocator_type *)local_b0);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_f8);
  local_b0._0_8_ = local_b0._0_8_ & 0xffffffff00000000;
  local_138._0_8_ = piVar13;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_138 + 8),_Var5,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var5._M_current + 3),(CoordinateOrder *)local_b0,&andres::defaultOrder,
             (allocator_type *)local_70);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::transpose
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138,0,1);
  sVar16 = 0;
  do {
    sVar14 = 0;
    do {
      uVar10 = 0;
      do {
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_f8);
        uVar2 = local_f8._0_8_;
        if (((int *)local_f8._0_8_ == (int *)0x0) || (local_d0 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
LAB_001aa1e4:
          pcVar9 = std::runtime_error::~runtime_error;
          puVar12 = &std::runtime_error::typeinfo;
LAB_001aa1f2:
          __cxa_throw(plVar8,puVar12,pcVar9);
        }
        sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_f8,0);
        sVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_f8,3,sVar14,
                           uVar10);
        iVar1 = *(int *)(uVar2 + (sVar6 * sVar16 + sVar7) * 4);
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138);
        uVar2 = local_138._0_8_;
        if (((int *)local_138._0_8_ == (int *)0x0) || (local_110 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
          goto LAB_001aa1e4;
        }
        sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138,0);
        sVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138,3,sVar16,
                           uVar10);
        if (iVar1 != *(int *)(uVar2 + (sVar6 * sVar14 + sVar7) * 4)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar8,"test failed.");
          pcVar9 = std::logic_error::~logic_error;
          puVar12 = &std::logic_error::typeinfo;
          goto LAB_001aa1f2;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 == 1);
      sVar14 = sVar14 + 1;
    } while (sVar14 != 4);
    sVar16 = sVar16 + 1;
  } while (sVar16 != 3);
  operator_delete(local_128,local_110 * 0x18);
  operator_delete(local_e8,local_d0 * 0x18);
  operator_delete(_Var5._M_current,0x18);
  _Var5._M_current = (unsigned_long *)operator_new(0x18);
  *_Var5._M_current = 0;
  _Var5._M_current[1] = 0;
  *_Var5._M_current = 3;
  _Var5._M_current[1] = 4;
  _Var5._M_current[2] = 2;
  local_f8._0_8_ = piVar13;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_f8 + 8),_Var5,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var5._M_current + 3),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)local_138);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_f8);
  local_138._0_8_ = piVar13;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_138 + 8),_Var5,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var5._M_current + 3),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)local_b0);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::transpose
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138,0,2);
  uVar10 = 0;
  do {
    sVar16 = 0;
    do {
      uVar11 = 0;
      do {
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_f8);
        uVar2 = local_f8._0_8_;
        if (((int *)local_f8._0_8_ == (int *)0x0) || (local_d0 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
LAB_001aa260:
          pcVar9 = std::runtime_error::~runtime_error;
          puVar12 = &std::runtime_error::typeinfo;
LAB_001aa26e:
          __cxa_throw(plVar8,puVar12,pcVar9);
        }
        sVar14 = andres::View<int,_true,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_true,_std::allocator<unsigned_long>_> *)local_f8,0);
        sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_f8,3,sVar16,
                           uVar11);
        iVar1 = *(int *)(uVar2 + (sVar14 * uVar10 + sVar6) * 4);
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138);
        uVar2 = local_138._0_8_;
        if (((int *)local_138._0_8_ == (int *)0x0) || (local_110 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
          goto LAB_001aa260;
        }
        sVar14 = andres::View<int,_true,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138,0);
        sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138,3,sVar16,
                           uVar10);
        if (iVar1 != *(int *)(uVar2 + (sVar14 * uVar11 + sVar6) * 4)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar8,"test failed.");
          pcVar9 = std::logic_error::~logic_error;
          puVar12 = &std::logic_error::typeinfo;
          goto LAB_001aa26e;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 == 1);
      sVar16 = sVar16 + 1;
    } while (sVar16 != 4);
    uVar10 = uVar10 + 1;
  } while (uVar10 != 3);
  operator_delete(local_128,local_110 * 0x18);
  operator_delete(local_e8,local_d0 * 0x18);
  operator_delete(_Var5._M_current,0x18);
  _Var5._M_current = (unsigned_long *)operator_new(0x18);
  *_Var5._M_current = 0;
  _Var5._M_current[1] = 0;
  *_Var5._M_current = 3;
  _Var5._M_current[1] = 4;
  _Var5._M_current[2] = 2;
  local_138._0_8_ = local_138._0_8_ & 0xffffffff00000000;
  local_f8._0_8_ = piVar13;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_f8 + 8),_Var5,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var5._M_current + 3),(CoordinateOrder *)local_138,&andres::defaultOrder,
             (allocator_type *)local_b0);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_f8);
  local_b0._0_8_ = local_b0._0_8_ & 0xffffffff00000000;
  local_138._0_8_ = piVar13;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_138 + 8),_Var5,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var5._M_current + 3),(CoordinateOrder *)local_b0,&andres::defaultOrder,
             (allocator_type *)local_70);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::transpose
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138,0,2);
  uVar10 = 0;
  do {
    sVar16 = 0;
    do {
      uVar11 = 0;
      do {
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_f8);
        uVar2 = local_f8._0_8_;
        if (((int *)local_f8._0_8_ == (int *)0x0) || (local_d0 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
LAB_001aa2dc:
          pcVar9 = std::runtime_error::~runtime_error;
          puVar12 = &std::runtime_error::typeinfo;
LAB_001aa2ea:
          __cxa_throw(plVar8,puVar12,pcVar9);
        }
        sVar14 = andres::View<int,_true,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_true,_std::allocator<unsigned_long>_> *)local_f8,0);
        sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_f8,3,sVar16,
                           uVar11);
        iVar1 = *(int *)(uVar2 + (sVar14 * uVar10 + sVar6) * 4);
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138);
        uVar2 = local_138._0_8_;
        if (((int *)local_138._0_8_ == (int *)0x0) || (local_110 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
          goto LAB_001aa2dc;
        }
        sVar14 = andres::View<int,_true,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138,0);
        sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138,3,sVar16,
                           uVar10);
        if (iVar1 != *(int *)(uVar2 + (sVar14 * uVar11 + sVar6) * 4)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar8,"test failed.");
          pcVar9 = std::logic_error::~logic_error;
          puVar12 = &std::logic_error::typeinfo;
          goto LAB_001aa2ea;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 == 1);
      sVar16 = sVar16 + 1;
    } while (sVar16 != 4);
    uVar10 = uVar10 + 1;
  } while (uVar10 != 3);
  operator_delete(local_128,local_110 * 0x18);
  operator_delete(local_e8,local_d0 * 0x18);
  operator_delete(_Var5._M_current,0x18);
  _Var5._M_current = (unsigned_long *)operator_new(0x18);
  *_Var5._M_current = 0;
  _Var5._M_current[1] = 0;
  *_Var5._M_current = 3;
  _Var5._M_current[1] = 4;
  _Var5._M_current[2] = 2;
  local_f8._0_8_ = piVar13;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_f8 + 8),_Var5,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var5._M_current + 3),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)local_138);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_f8);
  local_138._0_8_ = piVar13;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_138 + 8),_Var5,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var5._M_current + 3),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)local_b0);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::transpose
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138,1,2);
  lVar15 = 0;
  do {
    sVar16 = 0;
    do {
      sVar14 = 0;
      do {
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_f8);
        uVar2 = local_f8._0_8_;
        if (((int *)local_f8._0_8_ == (int *)0x0) || (local_d0 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
LAB_001aa358:
          pcVar9 = std::runtime_error::~runtime_error;
          puVar12 = &std::runtime_error::typeinfo;
LAB_001aa366:
          __cxa_throw(plVar8,puVar12,pcVar9);
        }
        sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_f8,0);
        sVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_f8,3,sVar16,
                           sVar14);
        iVar1 = *(int *)(uVar2 + (sVar6 * lVar15 + sVar7) * 4);
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138);
        uVar2 = local_138._0_8_;
        if (((int *)local_138._0_8_ == (int *)0x0) || (local_110 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
          goto LAB_001aa358;
        }
        sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138,0);
        sVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138,3,sVar14,
                           sVar16);
        if (iVar1 != *(int *)(uVar2 + (sVar6 * lVar15 + sVar7) * 4)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar8,"test failed.");
          pcVar9 = std::logic_error::~logic_error;
          puVar12 = &std::logic_error::typeinfo;
          goto LAB_001aa366;
        }
        sVar14 = sVar14 + 1;
      } while (sVar14 == 1);
      sVar16 = sVar16 + 1;
    } while (sVar16 != 4);
    lVar15 = lVar15 + 1;
  } while (lVar15 != 3);
  operator_delete(local_128,local_110 * 0x18);
  operator_delete(local_e8,local_d0 * 0x18);
  operator_delete(_Var5._M_current,0x18);
  _Var5._M_current = (unsigned_long *)operator_new(0x18);
  *_Var5._M_current = 0;
  _Var5._M_current[1] = 0;
  *_Var5._M_current = 3;
  _Var5._M_current[1] = 4;
  _Var5._M_current[2] = 2;
  local_138._0_8_ = local_138._0_8_ & 0xffffffff00000000;
  local_f8._0_8_ = piVar13;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_f8 + 8),_Var5,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var5._M_current + 3),(CoordinateOrder *)local_138,&andres::defaultOrder,
             (allocator_type *)local_b0);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_f8);
  local_b0._0_8_ = local_b0._0_8_ & 0xffffffff00000000;
  local_138._0_8_ = piVar13;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_138 + 8),_Var5,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var5._M_current + 3),(CoordinateOrder *)local_b0,&andres::defaultOrder,
             (allocator_type *)local_70);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::transpose
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138,1,2);
  lVar15 = 0;
  do {
    sVar16 = 0;
    do {
      sVar14 = 0;
      do {
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_f8);
        uVar2 = local_f8._0_8_;
        if (((int *)local_f8._0_8_ == (int *)0x0) || (local_d0 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
LAB_001aa3d4:
          pcVar9 = std::runtime_error::~runtime_error;
          puVar12 = &std::runtime_error::typeinfo;
LAB_001aa3e2:
          __cxa_throw(plVar8,puVar12,pcVar9);
        }
        sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_f8,0);
        sVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_f8,3,sVar16,
                           sVar14);
        iVar1 = *(int *)(uVar2 + (sVar6 * lVar15 + sVar7) * 4);
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138);
        uVar2 = local_138._0_8_;
        if (((int *)local_138._0_8_ == (int *)0x0) || (local_110 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
          goto LAB_001aa3d4;
        }
        sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138,0);
        sVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138,3,sVar14,
                           sVar16);
        if (iVar1 != *(int *)(uVar2 + (sVar6 * lVar15 + sVar7) * 4)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar8,"test failed.");
          pcVar9 = std::logic_error::~logic_error;
          puVar12 = &std::logic_error::typeinfo;
          goto LAB_001aa3e2;
        }
        sVar14 = sVar14 + 1;
      } while (sVar14 == 1);
      sVar16 = sVar16 + 1;
    } while (sVar16 != 4);
    lVar15 = lVar15 + 1;
    if (lVar15 == 3) {
      operator_delete(local_128,local_110 * 0x18);
      operator_delete(local_e8,local_d0 * 0x18);
      operator_delete(_Var5._M_current,0x18);
      return;
    }
  } while( true );
}

Assistant:

void ViewTest::transposeTest()
{
    // 2D
    {
        std::vector<std::size_t> shape(2);
        shape[0] = 6; 
        shape[1] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::View<int, constTarget> w1(shape.begin(), shape.end(), data_);
        andres::View<int, constTarget> w2(shape.begin(), shape.end(), data_);
        andres::View<int, constTarget> w3(shape.begin(), shape.end(), data_);
        w1.transpose(0,1);
        w2.transpose(0,0);
        w3.transpose(1,1);

        for(std::size_t x=0; x<6; ++x) {
            for(std::size_t y=0; y<4; ++y) {
                test(v(x, y) == w1(y, x));
                test(v(x, y) == w2(x, y));
                test(v(x, y) == w3(x, y));
            }
        }
    }
    {
        std::vector<std::size_t> shape(2);
        shape[0] = 6; 
        shape[1] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        andres::View<int, constTarget> w1(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        andres::View<int, constTarget> w2(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        andres::View<int, constTarget> w3(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        w1.transpose(0,1);
        w2.transpose(0,0);
        w3.transpose(1,1);

        for(std::size_t x=0; x<6; ++x) {
            for(std::size_t y=0; y<4; ++y) {
                test(v(x, y) == w1(y, x));
                test(v(x, y) == w2(x, y));
                test(v(x, y) == w3(x, y));
            }
        }
    }
    // 3D with...
    {
        // shape[0], shape[1]
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            andres::View<int, constTarget> w(shape.begin(), shape.end(), data_);
            w.transpose(0,1);

            for(std::size_t x=0; x<3; ++x) {
                for(std::size_t y=0; y<4; ++y) {
                    for(std::size_t z=0; z<2; ++z) {
                        test(v(x, y, z) == w(y, x, z));
                    }
                }
            }
        }
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            andres::View<int, constTarget> w(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            w.transpose(0,1);

            for(std::size_t x=0; x<3; ++x) {
                for(std::size_t y=0; y<4; ++y) {
                    for(std::size_t z=0; z<2; ++z) {
                        test(v(x, y, z) == w(y, x, z));
                    }
                }
            }
        }
        // shape[0], shape[2]
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            andres::View<int, constTarget> w(shape.begin(), shape.end(), data_);
            w.transpose(0,2);

            for(std::size_t x=0; x<3; ++x) {
                for(std::size_t y=0; y<4; ++y) {
                    for(std::size_t z=0; z<2; ++z) {

                        test(v(x, y, z) == w(z, y, x));
                    }
                }
            }
        }
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            andres::View<int, constTarget> w(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            w.transpose(0,2);

            for(std::size_t x=0; x<3; ++x) {
                for(std::size_t y=0; y<4; ++y) {
                    for(std::size_t z=0; z<2; ++z) {
                        test(v(x, y, z) == w(z, y, x));
                    }
                }
            }
        }
        // shape[1], shape[2]
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            andres::View<int, constTarget> w(shape.begin(), shape.end(), data_);
            w.transpose(1,2);

            for(std::size_t x=0; x<3; ++x) {
                for(std::size_t y=0; y<4; ++y) {
                    for(std::size_t z=0; z<2; ++z) {
                        test(v(x, y, z) == w(x, z, y));
                    }
                }
            }
        }
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            andres::View<int, constTarget> w(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            w.transpose(1,2);

            for(std::size_t x=0; x<3; ++x) {
                for(std::size_t y=0; y<4; ++y) {
                    for(std::size_t z=0; z<2; ++z) {
                        test(v(x, y, z) == w(x, z, y));
                    }
                }
            }
        }
    }
}